

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture3DShader::Texture3DShader
          (Texture3DShader *this,DataType samplerType,DataType outputType)

{
  ShaderProgramDeclaration *pSVar1;
  char *pcVar2;
  allocator<char> local_454;
  allocator<char> local_453;
  allocator<char> local_452;
  allocator<char> local_451;
  allocator<char> local_450;
  allocator<char> local_44f;
  allocator<char> local_44e;
  allocator<char> local_44d;
  FragmentOutput local_44c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  FragmentSource local_348;
  string local_328 [32];
  VertexSource local_308;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  VertexToFragmentVarying local_228;
  Uniform local_220;
  Uniform local_1f8;
  Uniform local_1d0;
  Uniform local_1a8;
  VertexAttribute local_180;
  VertexAttribute local_158;
  ShaderProgramDeclaration local_130;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_130);
  std::__cxx11::string::string<std::allocator<char>>(local_248,"a_position",&local_44d);
  std::__cxx11::string::string((string *)&local_158,local_248);
  local_158.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_130,&local_158);
  std::__cxx11::string::string<std::allocator<char>>(local_268,"a_coord",&local_44e);
  std::__cxx11::string::string((string *)&local_180,local_268);
  local_180.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_180);
  local_228.type = GENERICVECTYPE_FLOAT;
  local_228.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_228);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_44c.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_44c.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_44c.type = GENERICVECTYPE_INT32;
  }
  else {
    local_44c.type = GENERICVECTYPE_LAST;
  }
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_44c);
  std::__cxx11::string::string<std::allocator<char>>(local_288,"u_sampler0",&local_44f);
  std::__cxx11::string::string((string *)&local_1a8,local_288);
  local_1a8.type = samplerType;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"u_scale",&local_450);
  std::__cxx11::string::string((string *)&local_1d0,local_2a8);
  local_1d0.type = TYPE_FLOAT_VEC4;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"u_bias",&local_451);
  std::__cxx11::string::string((string *)&local_1f8,local_2c8);
  local_1f8.type = TYPE_FLOAT_VEC4;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>(local_2e8,"u_depth",&local_452);
  std::__cxx11::string::string((string *)&local_220,local_2e8);
  local_220.type = TYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_453);
  std::__cxx11::string::string((string *)&local_308,local_328);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,glcts::fixed_sample_locations_values + 1,&local_454);
  std::operator+(&local_428,&local_448,"#version 300 es\nuniform highp ");
  pcVar2 = glu::getDataTypeName(samplerType);
  std::operator+(&local_408,&local_428,pcVar2);
  std::operator+(&local_3e8,&local_408,
                 " u_sampler0;\nuniform highp vec4 u_scale;\nuniform highp vec4 u_bias;\nuniform highp float u_depth;\nin highp vec2 v_coord;\nlayout(location = 0) out highp "
                );
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_3c8,&local_3e8,pcVar2);
  std::operator+(&local_3a8,&local_3c8," o_color;\nvoid main (void)\n{\n\to_color = ");
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_388,&local_3a8,pcVar2);
  std::operator+(&local_368,&local_388,
                 "(vec4(texture(u_sampler0, vec3(v_coord, u_depth))) * u_scale + u_bias);\n}\n");
  std::__cxx11::string::string((string *)&local_348,(string *)&local_368);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_348);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string(local_248);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_130);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e451a8;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e451e0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e451f8;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&(this->super_ShaderProgram).field_0x154,1.0);
  tcu::Vector<float,_4>::Vector(&this->m_texBias,0.0);
  this->m_depth = 0.0;
  this->m_outputType = outputType;
  return;
}

Assistant:

Texture3DShader::Texture3DShader (glu::DataType samplerType, glu::DataType outputType)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
							<< sglr::pdec::Uniform("u_sampler0", samplerType)
							<< sglr::pdec::Uniform("u_scale", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_bias", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_depth", glu::TYPE_FLOAT)
							<< sglr::pdec::VertexSource(
									"#version 300 es\n"
									"in highp vec4 a_position;\n"
									"in highp vec2 a_coord;\n"
									"out highp vec2 v_coord;\n"
									"void main (void)\n"
									"{\n"
									"	gl_Position = a_position;\n"
									"	v_coord = a_coord;\n"
									"}\n")
							<< sglr::pdec::FragmentSource(
									string("") +
									"#version 300 es\n"
									"uniform highp " + glu::getDataTypeName(samplerType) + " u_sampler0;\n"
									"uniform highp vec4 u_scale;\n"
									"uniform highp vec4 u_bias;\n"
									"uniform highp float u_depth;\n"
									"in highp vec2 v_coord;\n"
									"layout(location = 0) out highp " + glu::getDataTypeName(outputType) + " o_color;\n"
									"void main (void)\n"
									"{\n"
									"	o_color = " + glu::getDataTypeName(outputType) + "(vec4(texture(u_sampler0, vec3(v_coord, u_depth))) * u_scale + u_bias);\n"
									"}\n"))
	, m_texScale	(1.0f)
	, m_texBias		(0.0f)
	, m_depth		(0.0f)
	, m_outputType	(outputType)
{
}